

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_3fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  int count;
  int iVar4;
  int iVar5;
  ON_TextureCoordinates *pOVar6;
  ON_3fPoint *pOVar7;
  ON_Mesh *mesh_00;
  ON_RenderMeshInfo *pRenderMeshInfo;
  ON_2fPoint *pOVar8;
  ON_3fVector *pOVar9;
  ON_3fPoint *pOVar10;
  double local_e20;
  double local_e18;
  ON_3fVector *local_dc0;
  ON_3dPoint local_da0;
  undefined1 auStack_d88 [8];
  ON_3dPoint ptT;
  int local_d64;
  undefined1 local_d60 [4];
  int i_local;
  CMeshClosestPointMapper meshMapper;
  ON_Mesh *pMesh;
  ON_Xform local_498;
  ON_Xform local_408;
  ON_Xform local_388;
  undefined1 local_308 [8];
  ON_Xform matN;
  ON_Xform matP;
  ON_2fPointArray temp_tcs;
  int sd;
  double w;
  float *f_1;
  double *NT;
  double *PT;
  ON_Xform N_xform;
  ON_Xform P_xform;
  int *Tsd;
  ON_3fVector *mesh_N;
  ON_3fPoint *mesh_V;
  ON_3dVector N;
  ON_3dPoint tc;
  ON_3dPoint P;
  ON_3fPoint *pOStack_60;
  bool rc;
  ON_3fPoint *d;
  ON_2fPoint *f;
  int tccount;
  int tci;
  int vcnt;
  int i;
  ON_SimpleArray<int> *Tside_local;
  bool bLazy_local;
  ON_Xform *mesh_xform_local;
  ON_SimpleArray<ON_3fPoint> *T_local;
  ON_Mesh *mesh_local;
  ON_TextureMapping *this_local;
  
  if (Tside != (ON_SimpleArray<int> *)0x0) {
    ON_SimpleArray<int>::SetCount(Tside,0);
  }
  count = ON_SimpleArray<ON_3fPoint>::Count(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  if (count < 1) {
    this_local._7_1_ = false;
  }
  else {
    if (bLazy) {
      iVar4 = ON_ClassArray<ON_TextureCoordinates>::Count(&mesh->m_TC);
      for (f._4_4_ = 0; f._4_4_ < iVar4; f._4_4_ = f._4_4_ + 1) {
        pOVar6 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,f._4_4_);
        iVar5 = ON_SimpleArray<ON_3fPoint>::Count(&pOVar6->m_T);
        if (count == iVar5) {
          pOVar6 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,f._4_4_);
          bVar3 = HasMatchingTextureCoordinates(this,&pOVar6->m_tag,mesh_xform);
          if (bVar3) {
            pOVar6 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,f._4_4_);
            ON_SimpleArray<ON_3fPoint>::operator=(T,&pOVar6->m_T);
            return true;
          }
        }
      }
      bVar3 = HasMatchingTextureCoordinates(this,mesh,mesh_xform);
      if (bVar3) {
        ON_SimpleArray<ON_3fPoint>::Reserve(T,(long)count);
        ON_SimpleArray<ON_3fPoint>::SetCount(T,count);
        d = (ON_3fPoint *)
            ON_SimpleArray<ON_2fPoint>::Array(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
        pOStack_60 = ON_SimpleArray<ON_3fPoint>::Array(T);
        tci = count;
        while (tci != 0) {
          pOStack_60->x = d->x;
          pOStack_60->y = d->y;
          pOStack_60->z = 0.0;
          d = (ON_3fPoint *)&d->z;
          pOStack_60 = pOStack_60 + 1;
          tci = tci + -1;
        }
        return true;
      }
    }
    if (this->m_type == srfp_mapping) {
      ON_SimpleArray<ON_3fPoint>::Reserve(T,(long)count);
      ON_SimpleArray<ON_3fPoint>::SetCount(T,count);
      ON_SimpleArray<ON_3fPoint>::Zero(T);
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[](T,0);
      P.z._7_1_ = GetSPTCHelper(mesh,this,&pOVar7->x,3);
    }
    else {
      ON_3dVector::ON_3dVector((ON_3dVector *)&mesh_V,0.0,0.0,0.0);
      pOVar7 = ON_SimpleArray<ON_3fPoint>::Array(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
      bVar3 = ON_Mesh::HasVertexNormals(mesh);
      if (bVar3) {
        local_dc0 = ON_SimpleArray<ON_3fVector>::Array
                              (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>);
      }
      else {
        local_dc0 = (ON_3fVector *)0x0;
      }
      ON_SimpleArray<ON_3fPoint>::Reserve(T,(long)count);
      ON_SimpleArray<ON_3fPoint>::SetCount(T,count);
      P_xform.m_xform[3][3] = 0.0;
      if (Tside != (ON_SimpleArray<int> *)0x0) {
        ON_SimpleArray<int>::Reserve(Tside,(long)count);
        ON_SimpleArray<int>::SetCount(Tside,count);
        P_xform.m_xform[3][3] = (double)ON_SimpleArray<int>::Array(Tside);
        memset((void *)P_xform.m_xform[3][3],0,(long)count << 2);
      }
      memcpy(N_xform.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
      memcpy(&PT,&ON_Xform::IdentityTransformation,0x80);
      NT = (double *)0x0;
      f_1 = (float *)0x0;
      if (((mesh_xform != (ON_Xform *)0x0) && (bVar3 = ON_Xform::IsZero(mesh_xform), !bVar3)) &&
         (bVar3 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar3)) {
        dVar2 = ON_Xform::GetMappingXforms
                          (mesh_xform,(ON_Xform *)(N_xform.m_xform[3] + 3),(ON_Xform *)&PT);
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          NT = ON_Xform::operator[]((ON_Xform *)(N_xform.m_xform[3] + 3),0);
          f_1 = (float *)ON_Xform::operator[]((ON_Xform *)&PT,0);
        }
      }
      if (((this->m_projection == clspt_projection) &&
          ((this->m_type == mesh_mapping_primitive || (this->m_type == brep_mapping_primitive)))) &&
         (bVar3 = std::operator!=((nullptr_t)0x0,&this->m_mapping_primitive), bVar3)) {
        P.z._7_1_ = false;
        ON_2fPointArray::ON_2fPointArray((ON_2fPointArray *)(matP.m_xform[3] + 3));
        memcpy(matN.m_xform[3] + 3,&this->m_Pxyz,0x80);
        memcpy(local_308,&this->m_Nxyz,0x80);
        if (NT != (double *)0x0) {
          ON_Xform::ON_Xform(&local_408,NT);
          ON_Xform::operator*(&local_388,(ON_Xform *)(matN.m_xform[3] + 3),&local_408);
          memcpy(matN.m_xform[3] + 3,&local_388,0x80);
        }
        if (f_1 != (float *)0x0) {
          ON_Xform::ON_Xform((ON_Xform *)&pMesh,(double *)f_1);
          ON_Xform::operator*(&local_498,(ON_Xform *)local_308,(ON_Xform *)&pMesh);
          memcpy(local_308,&local_498,0x80);
        }
        if ((this->m_type == mesh_mapping_primitive) &&
           (mesh_00 = CustomMappingMeshPrimitive(this), meshMapper._2104_8_ = mesh_00,
           mesh_00 != (ON_Mesh *)0x0)) {
          pRenderMeshInfo = ON_Mesh::GetRenderMeshInfo(mesh);
          CMeshClosestPointMapper::CMeshClosestPointMapper
                    ((CMeshClosestPointMapper *)local_d60,mesh_00,&mesh_00->m_T,pRenderMeshInfo,
                     (ON_Xform *)(matN.m_xform[3] + 3));
          P.z._7_1_ = ProjectTextureCoordinates
                                ((IClosestPointMapper *)local_d60,mesh,
                                 (ON_2fPointArray *)(matP.m_xform[3] + 3),matN.m_xform[3] + 3,
                                 (double *)local_308);
          CMeshClosestPointMapper::~CMeshClosestPointMapper((CMeshClosestPointMapper *)local_d60);
        }
        if (P.z._7_1_ != false) {
          for (local_d64 = 0;
              iVar4 = ON_SimpleArray<ON_2fPoint>::Count
                                ((ON_SimpleArray<ON_2fPoint> *)(matP.m_xform[3] + 3)),
              local_d64 < iVar4; local_d64 = local_d64 + 1) {
            pOVar8 = ON_SimpleArray<ON_2fPoint>::operator[]
                               ((ON_SimpleArray<ON_2fPoint> *)(matP.m_xform[3] + 3),local_d64);
            fVar1 = pOVar8->x;
            pOVar8 = ON_SimpleArray<ON_2fPoint>::operator[]
                               ((ON_SimpleArray<ON_2fPoint> *)(matP.m_xform[3] + 3),local_d64);
            ON_3dPoint::ON_3dPoint((ON_3dPoint *)auStack_d88,(double)fVar1,(double)pOVar8->y,0.0);
            ON_Xform::operator*(&local_da0,&this->m_uvw,(ON_3dPoint *)auStack_d88);
            ptT.y = local_da0.z;
            auStack_d88 = (undefined1  [8])local_da0.x;
            ptT.x = local_da0.y;
            pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[](T,local_d64);
            ON_3fPoint::Set(pOVar7,(float)(double)auStack_d88,(float)ptT.x,(float)ptT.y);
          }
          if (P_xform.m_xform[3][3] != 0.0) {
            memset((void *)P_xform.m_xform[3][3],0,(long)count << 2);
          }
        }
        ON_2fPointArray::~ON_2fPointArray((ON_2fPointArray *)(matP.m_xform[3] + 3));
      }
      else if ((local_dc0 == (ON_3fVector *)0x0) ||
              ((((this->m_projection != ray_projection && (this->m_type != box_mapping)) &&
                (this->m_type != cylinder_mapping)) &&
               ((this->m_type != mesh_mapping_primitive && (this->m_type != wcsbox_projection))))))
      {
        if (NT == (double *)0x0) {
          for (tci = 0; tci < count; tci = tci + 1) {
            ON_3dPoint::operator=((ON_3dPoint *)&tc.z,pOVar7 + tci);
            iVar4 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                              (this,&tc.z,&mesh_V,&N.z);
            pOVar10 = ON_SimpleArray<ON_3fPoint>::operator[](T,tci);
            ON_3fPoint::operator=(pOVar10,(ON_3dPoint *)&N.z);
            if (P_xform.m_xform[3][3] != 0.0) {
              *(int *)((long)P_xform.m_xform[3][3] + (long)tci * 4) = iVar4;
            }
          }
        }
        else {
          for (tci = 0; tci < count; tci = tci + 1) {
            pOVar10 = pOVar7 + tci;
            local_e20 = NT[0xe] * (double)pOVar10->z +
                        NT[0xc] * (double)pOVar10->x + NT[0xd] * (double)pOVar10->y + NT[0xf];
            if ((local_e20 != 0.0) || (NAN(local_e20))) {
              local_e20 = 1.0 / local_e20;
            }
            else {
              local_e20 = 1.0;
            }
            tc.z = local_e20 *
                   (NT[2] * (double)pOVar10->z +
                    *NT * (double)pOVar10->x + NT[1] * (double)pOVar10->y + NT[3]);
            iVar4 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                              (this,&tc.z,&mesh_V,&N.z);
            pOVar10 = ON_SimpleArray<ON_3fPoint>::operator[](T,tci);
            ON_3fPoint::operator=(pOVar10,(ON_3dPoint *)&N.z);
            if (P_xform.m_xform[3][3] != 0.0) {
              *(int *)((long)P_xform.m_xform[3][3] + (long)tci * 4) = iVar4;
            }
          }
        }
      }
      else if ((NT == (double *)0x0) || (f_1 == (float *)0x0)) {
        for (tci = 0; tci < count; tci = tci + 1) {
          ON_3dPoint::operator=((ON_3dPoint *)&tc.z,pOVar7 + tci);
          ON_3dVector::operator=((ON_3dVector *)&mesh_V,local_dc0 + tci);
          iVar4 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                            (this,&tc.z,&mesh_V,&N.z);
          pOVar10 = ON_SimpleArray<ON_3fPoint>::operator[](T,tci);
          ON_3fPoint::operator=(pOVar10,(ON_3dPoint *)&N.z);
          if (P_xform.m_xform[3][3] != 0.0) {
            *(int *)((long)P_xform.m_xform[3][3] + (long)tci * 4) = iVar4;
          }
        }
      }
      else {
        for (tci = 0; tci < count; tci = tci + 1) {
          pOVar10 = pOVar7 + tci;
          local_e18 = NT[0xe] * (double)pOVar10->z +
                      NT[0xc] * (double)pOVar10->x + NT[0xd] * (double)pOVar10->y + NT[0xf];
          if ((local_e18 != 0.0) || (NAN(local_e18))) {
            local_e18 = 1.0 / local_e18;
          }
          else {
            local_e18 = 1.0;
          }
          tc.z = local_e18 *
                 (NT[2] * (double)pOVar10->z + *NT * (double)pOVar10->x + NT[1] * (double)pOVar10->y
                 + NT[3]);
          pOVar9 = local_dc0 + tci;
          mesh_V = (ON_3fPoint *)
                   (NT[2] * (double)pOVar9->z + *NT * (double)pOVar9->x + NT[1] * (double)pOVar9->y)
          ;
          N.x = NT[6] * (double)pOVar9->z + NT[4] * (double)pOVar9->x + NT[5] * (double)pOVar9->y;
          N.y = NT[10] * (double)pOVar9->z + NT[8] * (double)pOVar9->x + NT[9] * (double)pOVar9->y;
          ON_3dVector::Unitize((ON_3dVector *)&mesh_V);
          iVar4 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                            (this,&tc.z,&mesh_V,&N.z);
          pOVar10 = ON_SimpleArray<ON_3fPoint>::operator[](T,tci);
          ON_3fPoint::operator=(pOVar10,(ON_3dPoint *)&N.z);
          if (P_xform.m_xform[3][3] != 0.0) {
            *(int *)((long)P_xform.m_xform[3][3] + (long)tci * 4) = iVar4;
          }
        }
      }
      P.z._7_1_ = true;
    }
    this_local._7_1_ = P.z._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
          const ON_Mesh& mesh,
          ON_SimpleArray<ON_3fPoint>& T,
          const ON_Xform* mesh_xform,
          bool bLazy,
          ON_SimpleArray<int>* Tside
          ) const
{
  if ( Tside )
    Tside->SetCount(0);

  int i;
  const int vcnt = mesh.m_V.Count();
  if ( vcnt <= 0 )
    return false;

  if ( bLazy )
  {
    int tci, tccount = mesh.m_TC.Count();
    for ( tci = 0; tci < tccount; tci++ )
    {
      if ( vcnt == mesh.m_TC[tci].m_T.Count() )
      {
        if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
        {
          T = mesh.m_TC[tci].m_T;
          return true;
        }
      }
    }

    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      T.Reserve(vcnt);
      T.SetCount(vcnt);
      const ON_2fPoint* f = mesh.m_T.Array();
      ON_3fPoint* d = T.Array();
      for ( i = vcnt; i--; f++, d++ )
      {
        d->x = f->x;
        d->y = f->y;
        d->z = 0.0f;
      }
      return true;
    }
  }

	bool rc = false;

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    // uv textures from surface parameterization
    T.Reserve(vcnt);
    T.SetCount(vcnt);
    T.Zero();
    rc = GetSPTCHelper(mesh,*this,&T[0].x,3);
	}
  else
  {
    ON_3dPoint  P, tc;
		ON_3dVector N(0.0,0.0,0.0);

		const ON_3fPoint*  mesh_V = mesh.m_V.Array();
		const ON_3fVector* mesh_N = mesh.HasVertexNormals()
                              ? mesh.m_N.Array()
                              : 0;

    T.Reserve(vcnt);
    T.SetCount(vcnt);

    int* Tsd = 0;
    if ( Tside )
    {
      Tside->Reserve(vcnt);
      Tside->SetCount(vcnt);
      Tsd = Tside->Array();
      memset(Tsd,0,vcnt*sizeof(Tsd[0]));
    }

    ON_Xform P_xform(ON_Xform::IdentityTransformation), N_xform(ON_Xform::IdentityTransformation);
    const double* PT = 0;
    const double* NT = 0;
    if ( mesh_xform )
    {
      if ( mesh_xform->IsZero() || mesh_xform->IsIdentity() )
      {
        // ignore transformation
        mesh_xform = 0;
      }
      else if ( 0.0 != mesh_xform->GetMappingXforms(P_xform,N_xform) )
      {
        PT = &P_xform[0][0];
        NT = &N_xform[0][0];
      }
      else
      {
        mesh_xform = 0;
      }
    }

    const float* f;
    double w;
    int sd;

		if (ON_TextureMapping::PROJECTION::clspt_projection == m_projection
      && (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type || ON_TextureMapping::TYPE::brep_mapping_primitive == m_type)
      && nullptr != m_mapping_primitive)
		{
      rc = false;
			ON_2fPointArray temp_tcs;

			// Jussi, 11-Nov-2010: Apply mapping primitive transformations first

			ON_Xform matP(m_Pxyz);
			ON_Xform matN(m_Nxyz);

			if (nullptr != PT)
				matP = matP * ON_Xform(PT);

			if (nullptr != NT)
				matN = matN * ON_Xform(NT);

			if (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type)
			{
				const ON_Mesh * pMesh = CustomMappingMeshPrimitive();
				if (nullptr != pMesh)
				{
					CMeshClosestPointMapper meshMapper(*pMesh, pMesh->m_T, mesh.GetRenderMeshInfo(), matP);
					rc = ProjectTextureCoordinates(meshMapper, mesh, temp_tcs, &matP.m_xform[0][0], &matN.m_xform[0][0]);
				}
			}

      if (rc)
			{
				for (int i_local = 0; i_local < temp_tcs.Count(); i_local++)
				{
					// Jussi, 11-Nov-2010: Fix for the problem reported by Michael Fritzsche: Custom mesh mapping does not
					// obey uvw repeat settings. Solution: multiply the 'mapping coordinate' with m_uvw to
					// get the final texture coordinate.

					ON_3dPoint ptT(temp_tcs[i_local].x, temp_tcs[i_local].y, 0.0);
					ptT = m_uvw * ptT;
					T[i_local].Set((float)ptT.x, (float)ptT.y, (float)ptT.z);
				}

				if (nullptr != Tsd)
				{
					memset(Tsd, 0, vcnt * sizeof(int));
				}
			}
		}
		else if ( mesh_N &&
          (   ON_TextureMapping::PROJECTION::ray_projection == m_projection
           || ON_TextureMapping::TYPE::box_mapping == m_type
           || ON_TextureMapping::TYPE::cylinder_mapping == m_type
           || ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type
           || ON_TextureMapping::TYPE::wcsbox_projection == m_type
		   )
        )
  	{
			// calculation uses mesh vertex normal
      if ( PT && NT )
      {
        // need to transform vertex and normal
        // before calculating texture coordinates
			  for (i = 0; i < vcnt; i++)
			  {
          f = &mesh_V[i].x;
				  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
          w = (0.0 != w) ? 1.0/w : 1.0;
				  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
				  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
				  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);

          f = &mesh_N[i].x;
          N.x = PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2];
				  N.y = PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2];
				  N.z = PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2];
          N.Unitize();
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
			else
      {
        // mesh vertex and normal are ok
			  for (i = 0; i < vcnt; i++)
			  {
				  P = mesh_V[i];
				  N = mesh_N[i];
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
		}
		else if ( PT )
    {
      // normal is not used
      // mesh vertex needs to be transformed
      for ( i = 0; i < vcnt; i++ )
      {
        f = &mesh_V[i].x;
			  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
        w = (0.0 != w) ? 1.0/w : 1.0;
			  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
			  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
			  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);
        sd = Evaluate(P,N,&tc);
			  T[i] = tc;
        if ( Tsd )
          Tsd[i] = sd;
		  }
    }
    else
		{
			// normal is not used and mesh vertex is ok
			for ( i = 0; i < vcnt; i++ )
			{
				P = mesh_V[i];
				sd = Evaluate(P,N,&tc);
				T[i] = tc;
				if ( Tsd )
					Tsd[i] = sd;
			}
    }
    rc = true;
	}

	return rc;
}